

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::SetTaper(ON_Linetype *this,double startWidth,double endWidth)

{
  ON_LinetypePrivate *pOVar1;
  ON_2dPoint *__s;
  bool bVar2;
  ON_2dPoint local_30;
  
  bVar2 = 0.0 <= startWidth && 0.0 <= endWidth;
  if (bVar2) {
    pOVar1 = this->m_private;
    __s = (pOVar1->m_taper_points).m_a;
    if (__s != (ON_2dPoint *)0x0) {
      memset(__s,0,(long)(pOVar1->m_taper_points).m_capacity << 4);
    }
    (pOVar1->m_taper_points).m_count = 0;
    pOVar1 = this->m_private;
    ON_2dPoint::ON_2dPoint(&local_30,0.0,startWidth);
    ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_30);
    pOVar1 = this->m_private;
    ON_2dPoint::ON_2dPoint(&local_30,1.0,endWidth);
    ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_30);
  }
  return bVar2;
}

Assistant:

bool ON_Linetype::SetTaper(double startWidth, double endWidth)
{
  if (startWidth < 0 || endWidth < 0)
    return false;

  m_private->m_taper_points.Empty();
  m_private->m_taper_points.Append(ON_2dPoint(0, startWidth));
  m_private->m_taper_points.Append(ON_2dPoint(1.0, endWidth));
  return true;
}